

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
std::experimental::optional<const_Command_*>::optional
          (optional<const_Command_*> *this,optional<const_Command_*> *rhs)

{
  Command **ppCVar1;
  
  (this->super_OptionalBase<const_Command_*>).init_ = false;
  (this->super_OptionalBase<const_Command_*>).storage_.dummy_ = '\0';
  if ((rhs->super_OptionalBase<const_Command_*>).init_ == true) {
    ppCVar1 = operator*(rhs);
    (this->super_OptionalBase<const_Command_*>).storage_.value_ = *ppCVar1;
    (this->super_OptionalBase<const_Command_*>).init_ = true;
  }
  return;
}

Assistant:

optional(optional&& rhs) noexcept(is_nothrow_move_constructible<T>::value)
  : OptionalBase<T>()
  {
    if (rhs.initialized()) {
        ::new (static_cast<void*>(dataptr())) T(std::move(*rhs));
        OptionalBase<T>::init_ = true;
    }
  }